

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O0

_Bool move(char *from,char *to)

{
  int local_24;
  int ret;
  char *to_local;
  char *from_local;
  
  local_24 = rename(from,to);
  if (local_24 != 0) {
    remove(to);
    local_24 = rename(from,to);
  }
  if (local_24 != 0) {
    perror("puttygen: cannot move new file on to old one");
  }
  return local_24 == 0;
}

Assistant:

static bool move(char *from, char *to)
{
    int ret;

    ret = rename(from, to);
    if (ret) {
        /*
         * This OS may require us to remove the original file first.
         */
        remove(to);
        ret = rename(from, to);
    }
    if (ret) {
        perror("puttygen: cannot move new file on to old one");
        return false;
    }
    return true;
}